

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O2

void Abc_NtkStrashPerform(Abc_Ntk_t *pNtkOld,Abc_Ntk_t *pNtkNew,int fAllNodes,int fRecord)

{
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar1;
  int fRecord_00;
  int i;
  
  if (pNtkOld->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtkOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                  ,0x1a2,"void Abc_NtkStrashPerform(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
  }
  if (pNtkNew->ntkType == ABC_NTK_STRASH) {
    p = Abc_NtkDfsIter(pNtkOld,fAllNodes);
    for (i = 0; i < p->nSize; i = i + 1) {
      pObj = (Abc_Obj_t *)Vec_PtrEntry(p,i);
      if ((((pObj->pNtk->ntkFunc == ABC_FUNC_MAP) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) &&
          ((pObj->vFanins).nSize == 1)) && ((pObj->field_5).pData == (void *)0x0)) {
        pAVar1 = Abc_ObjChild0Copy(pObj);
      }
      else {
        pAVar1 = Abc_NodeStrash(pNtkNew,pObj,fRecord_00);
      }
      (pObj->field_6).pCopy = pAVar1;
    }
    Vec_PtrFree(p);
    return;
  }
  __assert_fail("Abc_NtkIsStrash(pNtkNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                ,0x1a3,"void Abc_NtkStrashPerform(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
}

Assistant:

void Abc_NtkStrashPerform( Abc_Ntk_t * pNtkOld, Abc_Ntk_t * pNtkNew, int fAllNodes, int fRecord )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNodeOld;
    int i; //, clk = Abc_Clock();
    assert( Abc_NtkIsLogic(pNtkOld) );
    assert( Abc_NtkIsStrash(pNtkNew) );
//    vNodes = Abc_NtkDfs( pNtkOld, fAllNodes );
    vNodes = Abc_NtkDfsIter( pNtkOld, fAllNodes );
//printf( "Nodes = %d. ", Vec_PtrSize(vNodes) );
//ABC_PRT( "Time", Abc_Clock() - clk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNodeOld, i )
    {
        if ( Abc_ObjIsBarBuf(pNodeOld) )
            pNodeOld->pCopy = Abc_ObjChild0Copy(pNodeOld);
        else
            pNodeOld->pCopy = Abc_NodeStrash( pNtkNew, pNodeOld, fRecord );
    }
    Vec_PtrFree( vNodes );
}